

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

uint aom_variance64x16_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  undefined4 in_register_0000000c;
  longlong lVar1;
  longlong extraout_RDX;
  uint *sse_00;
  __m128i *sse_01;
  __m128i vsse_00;
  __m128i vsum_00;
  int sum;
  __m128i vsum;
  __m128i vsse;
  __m128i *in_stack_ffffffffffffffa8;
  int local_4c;
  longlong local_48 [2];
  uint local_38 [6];
  
  lVar1 = CONCAT44(in_register_0000000c,ref_stride);
  sse_00 = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_4c = 0;
  sse_01 = &local_48;
  variance64_sse2(src,src_stride,ref,ref_stride,(int)sse_00,sse_01,in_stack_ffffffffffffffa8);
  vsse_00[1] = (longlong)&local_4c;
  vsse_00[0] = (longlong)sse;
  vsum_00[1] = lVar1;
  vsum_00[0] = extraout_RDX;
  variance_final_1024_pel_sse2(vsse_00,vsum_00,sse_00,(int *)sse_01);
  return *sse - (int)((ulong)((long)local_4c * (long)local_4c) >> 10);
}

Assistant:

unsigned int aom_mse8x8_sse2(const uint8_t *src, int src_stride,
                             const uint8_t *ref, int ref_stride,
                             unsigned int *sse) {
  aom_variance8x8_sse2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}